

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall Renderer::UpdateWindowTitle(Renderer *this,int score,int fps)

{
  SDL_Window *pSVar1;
  undefined8 uVar2;
  string local_128;
  string local_108;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string title;
  int fps_local;
  int score_local;
  Renderer *this_local;
  
  title.field_2._8_4_ = fps;
  title.field_2._12_4_ = score;
  std::__cxx11::to_string(&local_d8,score);
  std::operator+(&local_b8,"Your Score: [",&local_d8);
  std::operator+(&local_98,&local_b8,"]  highst score = [");
  std::__cxx11::to_string(&local_108,Mycontroller::highestScore);
  std::operator+(&local_78,&local_98,&local_108);
  std::operator+(&local_58,&local_78,"] FPS: ");
  std::__cxx11::to_string(&local_128,title.field_2._8_4_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  pSVar1 = this->sdl_window;
  uVar2 = std::__cxx11::string::c_str();
  SDL_SetWindowTitle(pSVar1,uVar2);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Renderer::UpdateWindowTitle(int score, int fps) {
  std::string title{"Your Score: [" + std::to_string(score) + "]  highst score = ["+ std::to_string(Mycontroller::highestScore) + "] FPS: " + std::to_string(fps)};
  SDL_SetWindowTitle(sdl_window, title.c_str());
}